

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

void __thiscall
fasttext::Model::findKBest
          (Model *this,int32_t k,real threshold,
          vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *heap,
          Vector *hidden,Vector *output)

{
  pointer *pppVar1;
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  __last;
  undefined4 extraout_var;
  __normal_iterator<std::pair<float,_int>_*,_std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>_>
  _Var2;
  long lVar3;
  long lVar4;
  real rVar5;
  float x;
  pair<float,_int> local_38;
  
  _Var2._M_current = (pair<float,_int> *)this;
  if (((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->loss ==
      ova) {
    computeOutputSigmoid(this,hidden,output);
  }
  else {
    computeOutputSoftmax(this,hidden,output);
  }
  lVar3 = 0;
  lVar4 = 0;
  do {
    if (this->osz_ <= lVar4) {
      return;
    }
    x = (output->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start[lVar4];
    if (threshold <= x) {
      if ((long)(heap->
                super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(heap->
                super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>).
                _M_impl.super__Vector_impl_data._M_start >> 3 == (long)k) {
        rVar5 = std_log((Model *)_Var2._M_current,x);
        if (rVar5 < ((heap->
                     super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                     )._M_impl.super__Vector_impl_data._M_start)->first) goto LAB_001301eb;
        x = (output->data_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[lVar4];
      }
      rVar5 = std_log((Model *)_Var2._M_current,x);
      local_38 = (pair<float,_int>)(CONCAT44(extraout_var,rVar5) + lVar3);
      std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>::
      emplace_back<std::pair<float,int>>
                ((vector<std::pair<float,int>,std::allocator<std::pair<float,int>>> *)heap,&local_38
                );
      std::
      push_heap<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,bool(*)(std::pair<float,int>const&,std::pair<float,int>const&)>
                ((heap->
                 super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start,
                 (heap->
                 super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>)
                 ._M_impl.super__Vector_impl_data._M_finish,comparePairs);
      __last._M_current =
           (heap->super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      _Var2._M_current =
           (heap->super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(long)k < (ulong)((long)__last._M_current - (long)_Var2._M_current >> 3)) {
        std::
        pop_heap<__gnu_cxx::__normal_iterator<std::pair<float,int>*,std::vector<std::pair<float,int>,std::allocator<std::pair<float,int>>>>,bool(*)(std::pair<float,int>const&,std::pair<float,int>const&)>
                  (_Var2,__last,comparePairs);
        pppVar1 = &(heap->
                   super__Vector_base<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *pppVar1 = *pppVar1 + -1;
      }
    }
LAB_001301eb:
    lVar4 = lVar4 + 1;
    lVar3 = lVar3 + 0x100000000;
  } while( true );
}

Assistant:

void Model::findKBest(
		int32_t k,
		real threshold,
		std::vector<std::pair<real, int32_t>>& heap,
		Vector& hidden,
		Vector& output) const {
	if (args_->loss == loss_name::ova) {
		computeOutputSigmoid(hidden, output);
	} else {
		computeOutputSoftmax(hidden, output);
	}
	for (int32_t i = 0; i < osz_; i++) {
		if (output[i] < threshold) {
			continue;
		}
		if (heap.size() == k && std_log(output[i]) < heap.front().first) {
			continue;
		}
		heap.push_back(std::make_pair(std_log(output[i]), i));
		std::push_heap(heap.begin(), heap.end(), comparePairs);
		if (heap.size() > k) {
			std::pop_heap(heap.begin(), heap.end(), comparePairs);
			heap.pop_back();
		}
	}
}